

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

AtomicRMW * __thiscall
wasm::Builder::makeAtomicRMW
          (Builder *this,AtomicRMWOp op,uint bytes,Address offset,Expression *ptr,Expression *value,
          Type type,Name memory)

{
  AtomicRMW *pAVar1;
  AtomicRMW *ret;
  Expression *value_local;
  Expression *ptr_local;
  uint bytes_local;
  AtomicRMWOp op_local;
  Builder *this_local;
  Type type_local;
  Address offset_local;
  
  pAVar1 = MixedArena::alloc<wasm::AtomicRMW>(&this->wasm->allocator);
  pAVar1->op = op;
  pAVar1->bytes = (uint8_t)bytes;
  (pAVar1->offset).addr = offset.addr;
  pAVar1->ptr = ptr;
  pAVar1->value = value;
  (pAVar1->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression.type.id = type.id;
  ::wasm::AtomicRMW::finalize();
  Name::operator=(&pAVar1->memory,&memory);
  return pAVar1;
}

Assistant:

AtomicRMW* makeAtomicRMW(AtomicRMWOp op,
                           unsigned bytes,
                           Address offset,
                           Expression* ptr,
                           Expression* value,
                           Type type,
                           Name memory) {
    auto* ret = wasm.allocator.alloc<AtomicRMW>();
    ret->op = op;
    ret->bytes = bytes;
    ret->offset = offset;
    ret->ptr = ptr;
    ret->value = value;
    ret->type = type;
    ret->finalize();
    ret->memory = memory;
    return ret;
  }